

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::SymDecryptInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Session *this_00;
  Token *token;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar6;
  long lVar7;
  uchar *puVar8;
  CryptoFactory *pCVar9;
  SymmetricAlgorithm *inSymmetricCryptoOp;
  SoftHSM *this_01;
  void *pvVar10;
  undefined4 extraout_var_01;
  size_t sVar11;
  SoftHSM *this_02;
  char *format;
  ulong uVar12;
  uint local_a4;
  undefined8 local_a0;
  long local_98;
  ByteString iv;
  ByteString aad;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  token = Session::getToken(this_00);
  if (token == (Token *)0x0) {
    return 5;
  }
  iVar4 = Session::getOpType(this_00);
  if (iVar4 != 0) {
    return 0x90;
  }
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar4 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar4 == '\0') {
    return 0x82;
  }
  iVar4 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar5 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar6 = haveRead(sessionState,(CK_BBOOL)iVar4,(CK_BBOOL)iVar5);
  if (CVar6 != 0) {
    if (CVar6 != 0x101) {
      return CVar6;
    }
    softHSMLog(6,"SymDecryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xb5e,"User is not authorized");
    return 0x101;
  }
  iVar4 = (*key->_vptr_OSObject[4])(key,0x105,0);
  if ((char)iVar4 == '\0') {
    return 0x68;
  }
  bVar3 = isMechanismPermitted(this,key,pMechanism);
  if (!bVar3) {
    return 0x70;
  }
  iVar4 = (*key->_vptr_OSObject[5])(key,0x100,0x80000000);
  lVar7 = CONCAT44(extraout_var,iVar4);
  ByteString::ByteString(&iv);
  ByteString::ByteString(&aad);
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x133) {
    if ((long)CVar1 < 0x125) {
      if (CVar1 == 0x121) {
        CVar6 = 99;
        if (lVar7 != 0x13) goto LAB_00131f18;
        local_a4 = 4;
      }
      else {
        if (CVar1 != 0x122) goto switchD_00131841_caseD_1083;
        CVar6 = 99;
        if (lVar7 != 0x13) goto LAB_00131f18;
        format = "CBC mode requires an init vector";
        iVar4 = 0xb89;
        if ((pMechanism->pParameter == (void *)0x0) || (pMechanism->ulParameterLen == 0))
        goto LAB_00131ef9;
        ByteString::resize(&iv,pMechanism->ulParameterLen);
        puVar8 = ByteString::operator[](&iv,0);
        memcpy(puVar8,pMechanism->pParameter,pMechanism->ulParameterLen);
        local_a4 = 1;
      }
      local_98 = 7;
      goto LAB_00131a08;
    }
    if (CVar1 == 0x125) {
      CVar6 = 99;
      if (lVar7 != 0x13) goto LAB_00131f18;
      format = "CBC mode requires an init vector";
      iVar4 = 0xb99;
      if ((pMechanism->pParameter != (void *)0x0) && (pMechanism->ulParameterLen != 0)) {
        ByteString::resize(&iv,pMechanism->ulParameterLen);
        puVar8 = ByteString::operator[](&iv,0);
        memcpy(puVar8,pMechanism->pParameter,pMechanism->ulParameterLen);
        local_98 = 7;
        local_a0 = 1;
        local_a4 = 1;
        goto LAB_00131a11;
      }
      goto LAB_00131ef9;
    }
    if (CVar1 == 0x132) {
      CVar6 = 99;
      if (lVar7 - 0x16U < 0xfffffffffffffffe) goto LAB_00131f18;
      local_a4 = 4;
LAB_00131940:
      local_98 = 7;
      goto LAB_00131a08;
    }
    goto switchD_00131841_caseD_1083;
  }
  switch(CVar1) {
  case 0x1081:
    CVar6 = 99;
    if (lVar7 != 0x1f) goto LAB_00131f18;
    local_98 = 8;
    local_a4 = 4;
LAB_00131a08:
    local_a0 = 0;
    break;
  case 0x1082:
    CVar6 = 99;
    if (lVar7 != 0x1f) goto LAB_00131f18;
    format = "CBC mode requires an init vector";
    iVar4 = 0xbd5;
    if ((pMechanism->pParameter == (void *)0x0) || (pMechanism->ulParameterLen == 0))
    goto LAB_00131ef9;
    ByteString::resize(&iv,pMechanism->ulParameterLen);
    puVar8 = ByteString::operator[](&iv,0);
    memcpy(puVar8,pMechanism->pParameter,pMechanism->ulParameterLen);
    local_98 = 8;
    local_a0 = 0;
    local_a4 = 1;
    break;
  case 0x1083:
  case 0x1084:
    goto switchD_00131841_caseD_1083;
  case 0x1085:
    CVar6 = 99;
    if (lVar7 != 0x1f) goto LAB_00131f18;
    format = "CBC mode requires an init vector";
    iVar4 = 0xbe4;
    if ((pMechanism->pParameter == (void *)0x0) || (pMechanism->ulParameterLen == 0))
    goto LAB_00131ef9;
    ByteString::resize(&iv,pMechanism->ulParameterLen);
    puVar8 = ByteString::operator[](&iv,0);
    memcpy(puVar8,pMechanism->pParameter,pMechanism->ulParameterLen);
    local_98 = 8;
    local_a0 = 1;
    lVar7 = 0;
    local_a4 = 1;
    goto LAB_00131a13;
  case 0x1086:
    CVar6 = 99;
    if (lVar7 != 0x1f) goto LAB_00131f18;
    format = "CTR mode requires a counter block";
    iVar4 = 0xbf2;
    if (((long *)pMechanism->pParameter != (long *)0x0) && (pMechanism->ulParameterLen == 0x18)) {
      lVar7 = *pMechanism->pParameter;
      if (lVar7 - 0x81U < 0xffffffffffffff80) {
        CVar6 = 0x71;
        softHSMLog(7,"SymDecryptInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xbf8,"Invalid ulCounterBits");
        goto LAB_00131f18;
      }
      ByteString::resize(&iv,0x10);
      puVar8 = ByteString::operator[](&iv,0);
      uVar2 = *(undefined8 *)((long)pMechanism->pParameter + 0x10);
      *(undefined8 *)puVar8 = *(undefined8 *)((long)pMechanism->pParameter + 8);
      *(undefined8 *)(puVar8 + 8) = uVar2;
      local_98 = 8;
      local_a4 = 3;
      local_a0 = 0;
      goto LAB_00131a13;
    }
    goto LAB_00131ef9;
  case 0x1087:
    CVar6 = 99;
    if (lVar7 != 0x1f) goto LAB_00131f18;
    format = "GCM mode requires parameters";
    iVar4 = 0xc06;
    if ((pMechanism->pParameter == (void *)0x0) || (pMechanism->ulParameterLen != 0x30))
    goto LAB_00131ef9;
    ByteString::resize(&iv,*(size_t *)((long)pMechanism->pParameter + 8));
    puVar8 = ByteString::operator[](&iv,0);
    memcpy(puVar8,*pMechanism->pParameter,*(size_t *)((long)pMechanism->pParameter + 8));
    ByteString::resize(&aad,*(size_t *)((long)pMechanism->pParameter + 0x20));
    pvVar10 = pMechanism->pParameter;
    if (*(long *)((long)pvVar10 + 0x20) != 0) {
      puVar8 = ByteString::operator[](&aad,0);
      memcpy(puVar8,*(void **)((long)pMechanism->pParameter + 0x18),
             *(size_t *)((long)pMechanism->pParameter + 0x20));
      pvVar10 = pMechanism->pParameter;
    }
    uVar12 = *(ulong *)((long)pvVar10 + 0x28);
    if (0x80 < uVar12 || (uVar12 & 7) != 0) {
      format = "Invalid ulTagBits value";
      iVar4 = 0xc11;
      goto LAB_00131ef9;
    }
    uVar12 = uVar12 >> 3;
    local_98 = 8;
    local_a4 = 5;
    local_a0 = 0;
    lVar7 = 0;
    goto LAB_00131a16;
  default:
    if (CVar1 == 0x133) {
      CVar6 = 99;
      if (lVar7 - 0x16U < 0xfffffffffffffffe) goto LAB_00131f18;
      format = "CBC mode requires an init vector";
      iVar4 = 0xbb0;
      if ((pMechanism->pParameter != (void *)0x0) && (pMechanism->ulParameterLen != 0)) {
        ByteString::resize(&iv,pMechanism->ulParameterLen);
        puVar8 = ByteString::operator[](&iv,0);
        memcpy(puVar8,pMechanism->pParameter,pMechanism->ulParameterLen);
        local_a4 = 1;
        goto LAB_00131940;
      }
    }
    else {
      if (CVar1 != 0x136) goto switchD_00131841_caseD_1083;
      CVar6 = 99;
      if (lVar7 - 0x16U < 0xfffffffffffffffe) goto LAB_00131f18;
      format = "CBC mode requires an init vector";
      iVar4 = 0xbc0;
      if ((pMechanism->pParameter != (void *)0x0) && (pMechanism->ulParameterLen != 0)) {
        ByteString::resize(&iv,pMechanism->ulParameterLen);
        puVar8 = ByteString::operator[](&iv,0);
        memcpy(puVar8,pMechanism->pParameter,pMechanism->ulParameterLen);
        local_98 = 7;
        local_a0 = 1;
        local_a4 = 1;
        break;
      }
    }
LAB_00131ef9:
    CVar6 = 7;
    softHSMLog(7,"SymDecryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar4,format);
    goto LAB_00131f18;
  }
LAB_00131a11:
  lVar7 = 0;
LAB_00131a13:
  uVar12 = 0;
LAB_00131a16:
  pCVar9 = CryptoFactory::i();
  iVar4 = (**pCVar9->_vptr_CryptoFactory)(pCVar9);
  inSymmetricCryptoOp = (SymmetricAlgorithm *)CONCAT44(extraout_var_00,iVar4);
  if (inSymmetricCryptoOp == (SymmetricAlgorithm *)0x0) {
switchD_00131841_caseD_1083:
    CVar6 = 0x70;
  }
  else {
    this_01 = (SoftHSM *)operator_new(0x38);
    this_02 = this_01;
    SymmetricKey::SymmetricKey((SymmetricKey *)this_01,0);
    CVar6 = getSymmetricKey(this_02,(SymmetricKey *)this_01,token,key);
    if (CVar6 == 0) {
      iVar4 = (*((Serialisable *)&this_01->_vptr_SoftHSM)->_vptr_Serialisable[4])(this_01);
      sVar11 = ByteString::size((ByteString *)CONCAT44(extraout_var_01,iVar4));
      (*((Serialisable *)&this_01->_vptr_SoftHSM)->_vptr_Serialisable[6])(this_01,sVar11 * local_98)
      ;
      iVar4 = (*inSymmetricCryptoOp->_vptr_SymmetricAlgorithm[5])
                        (inSymmetricCryptoOp,this_01,(ulong)local_a4,&iv,local_a0,lVar7,&aad,uVar12)
      ;
      if ((char)iVar4 == '\0') {
        (*inSymmetricCryptoOp->_vptr_SymmetricAlgorithm[10])(inSymmetricCryptoOp,this_01);
        pCVar9 = CryptoFactory::i();
        (*pCVar9->_vptr_CryptoFactory[1])(pCVar9,inSymmetricCryptoOp);
        CVar6 = 0x70;
      }
      else {
        Session::setOpType(this_00,3);
        Session::setSymmetricCryptoOp(this_00,inSymmetricCryptoOp);
        Session::setAllowMultiPartOp(this_00,true);
        Session::setAllowSinglePartOp(this_00,true);
        Session::setSymmetricKey(this_00,(SymmetricKey *)this_01);
        CVar6 = 0;
      }
    }
    else {
      (*inSymmetricCryptoOp->_vptr_SymmetricAlgorithm[10])(inSymmetricCryptoOp,this_01);
      pCVar9 = CryptoFactory::i();
      CVar6 = 5;
      (*pCVar9->_vptr_CryptoFactory[1])(pCVar9,inSymmetricCryptoOp);
    }
  }
LAB_00131f18:
  aad._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&aad.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  iv._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar6;
}

Assistant:

CK_RV SoftHSM::SymDecryptInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for decryption
	if (!key->getBooleanValue(CKA_DECRYPT, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;


	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get key info
	CK_KEY_TYPE keyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);

	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymMode::Type mode = SymMode::Unknown;
	bool padding = false;
	ByteString iv;
	size_t bb = 8;
	size_t counterBits = 0;
	ByteString aad;
	size_t tagBytes = 0;
	switch(pMechanism->mechanism) {
#ifndef WITH_FIPS
		case CKM_DES_ECB:
			if (keyType != CKK_DES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES;
			mode = SymMode::ECB;
			bb = 7;
			break;
		case CKM_DES_CBC:
			if (keyType != CKK_DES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES;
			mode = SymMode::CBC;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
		case CKM_DES_CBC_PAD:
			if (keyType != CKK_DES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES;
			mode = SymMode::CBC;
			padding = true;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
#endif
		case CKM_DES3_ECB:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES3;
			mode = SymMode::ECB;
			bb = 7;
			break;
		case CKM_DES3_CBC:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES3;
			mode = SymMode::CBC;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
		case CKM_DES3_CBC_PAD:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES3;
			mode = SymMode::CBC;
			padding = true;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
		case CKM_AES_ECB:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::ECB;
			break;
		case CKM_AES_CBC:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::CBC;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			break;
		case CKM_AES_CBC_PAD:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::CBC;
			padding = true;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			break;
		case CKM_AES_CTR:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::CTR;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_AES_CTR_PARAMS))
			{
				DEBUG_MSG("CTR mode requires a counter block");
				return CKR_ARGUMENTS_BAD;
			}
			counterBits = CK_AES_CTR_PARAMS_PTR(pMechanism->pParameter)->ulCounterBits;
			if (counterBits == 0 || counterBits > 128)
			{
				DEBUG_MSG("Invalid ulCounterBits");
				return CKR_MECHANISM_PARAM_INVALID;
			}
			iv.resize(16);
			memcpy(&iv[0], CK_AES_CTR_PARAMS_PTR(pMechanism->pParameter)->cb, 16);
			break;
		case CKM_AES_GCM:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::GCM;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_GCM_PARAMS))
			{
				DEBUG_MSG("GCM mode requires parameters");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulIvLen);
			memcpy(&iv[0], CK_GCM_PARAMS_PTR(pMechanism->pParameter)->pIv, CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulIvLen);
			aad.resize(CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulAADLen);
			if (CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulAADLen > 0)
				memcpy(&aad[0], CK_GCM_PARAMS_PTR(pMechanism->pParameter)->pAAD, CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulAADLen);
			tagBytes = CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulTagBits;
			if (tagBytes > 128 || tagBytes % 8 != 0)
			{
				DEBUG_MSG("Invalid ulTagBits value");
				return CKR_ARGUMENTS_BAD;
			}
			tagBytes = tagBytes / 8;
			break;
		default:
			return CKR_MECHANISM_INVALID;
	}
	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* secretkey = new SymmetricKey();

	if (getSymmetricKey(secretkey, token, key) != CKR_OK)
	{
		cipher->recycleKey(secretkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	secretkey->setBitLen(secretkey->getKeyBits().size() * bb);

	// Initialize decryption
	if (!cipher->decryptInit(secretkey, mode, iv, padding, counterBits, aad, tagBytes))
	{
		cipher->recycleKey(secretkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_MECHANISM_INVALID;
	}

	session->setOpType(SESSION_OP_DECRYPT);
	session->setSymmetricCryptoOp(cipher);
	session->setAllowMultiPartOp(true);
	session->setAllowSinglePartOp(true);
	session->setSymmetricKey(secretkey);

	return CKR_OK;
}